

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O0

void canvas_disconnect_with_undo(_glist *x,t_float index1,t_float outno,t_float index2,t_float inno)

{
  void *data;
  t_float inno_local;
  t_float index2_local;
  t_float outno_local;
  t_float index1_local;
  _glist *x_local;
  
  canvas_disconnect(x,index1,outno,index2,inno);
  data = canvas_undo_set_disconnect(x,(int)index1,(int)outno,(int)index2,(int)inno);
  canvas_undo_add(x,UNDO_DISCONNECT,"disconnect",data);
  return;
}

Assistant:

static void canvas_disconnect_with_undo(t_canvas *x,
    t_float index1, t_float outno, t_float index2, t_float inno)
{
    canvas_disconnect(x, index1, outno, index2, inno);
    canvas_undo_add(x, UNDO_DISCONNECT, "disconnect", canvas_undo_set_disconnect(x,
        index1, outno, index2, inno));
}